

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManMonitor.cpp
# Opt level: O3

void __thiscall
adios2::core::engine::DataManMonitor::AddLatencyMilliseconds
          (DataManMonitor *this,uint64_t remoteStamp)

{
  _Elt_pointer puVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint64_t latency;
  unsigned_long local_18;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  local_18 = lVar2 / 1000000 - (remoteStamp + this->m_ClockError);
  puVar1 = (this->m_LatencyMilliseconds).
           super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Deque_impl_data._M_finish._M_cur;
  if (puVar1 == (this->m_LatencyMilliseconds).
                super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Deque_impl_data._M_finish._M_last + -1) {
    std::deque<unsigned_long,std::allocator<unsigned_long>>::_M_push_back_aux<unsigned_long_const&>
              ((deque<unsigned_long,std::allocator<unsigned_long>> *)&this->m_LatencyMilliseconds,
               &local_18);
  }
  else {
    *puVar1 = local_18;
    (this->m_LatencyMilliseconds).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Deque_impl_data._M_finish._M_cur = puVar1 + 1;
  }
  auVar3._8_4_ = (int)(local_18 >> 0x20);
  auVar3._0_8_ = local_18;
  auVar3._12_4_ = 0x45300000;
  this->m_AccumulatedLatency =
       (auVar3._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)local_18) - 4503599627370496.0) +
       this->m_AccumulatedLatency;
  return;
}

Assistant:

void DataManMonitor::AddLatencyMilliseconds(const uint64_t remoteStamp)
{
    uint64_t localStamp = std::chrono::duration_cast<std::chrono::milliseconds>(
                              std::chrono::system_clock::now().time_since_epoch())
                              .count();
    uint64_t latency = localStamp - remoteStamp - m_ClockError;
    m_LatencyMilliseconds.push_back(latency);
    m_AccumulatedLatency += latency;
}